

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void sarima_predict(sarima_object obj,double *inp,int L,double *xpred,double *amse)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int s;
  int d;
  uint N;
  int D;
  uint ip;
  int iVar5;
  double *C;
  double *C_00;
  double *oup;
  double *W;
  double *resid;
  double *phi;
  double *theta;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  double *pdVar11;
  uint id;
  long lVar12;
  ulong uVar13;
  double dVar14;
  double local_38;
  
  uVar1 = obj->p;
  uVar2 = obj->q;
  uVar3 = obj->P;
  uVar4 = obj->Q;
  s = obj->s;
  lVar12 = (long)s;
  ip = s * uVar3 + uVar1;
  uVar9 = s * uVar4 + uVar2 + 1;
  if ((int)uVar9 < (int)ip) {
    uVar9 = ip;
  }
  d = obj->d;
  N = obj->N;
  D = obj->D;
  C = (double *)malloc((long)d * 8 + 8);
  iVar5 = s * D;
  C_00 = (double *)malloc((long)iVar5 * 8 + 8);
  id = iVar5 + d;
  oup = (double *)malloc((long)(int)id * 8 + 8);
  W = (double *)malloc((long)(int)N * 8);
  resid = (double *)malloc((long)(int)N * 8);
  phi = (double *)malloc((long)(int)uVar9 << 3);
  theta = (double *)malloc((long)(int)uVar9 << 3);
  *C_00 = 1.0;
  *C = 1.0;
  if (D == 0 && d == 0) {
    *oup = 1.0;
    local_38 = obj->mean;
  }
  else {
    if (0 < d) {
      deld(d,C);
    }
    local_38 = 0.0;
    if (0 < D) {
      delds(D,s,C_00);
    }
  }
  conv(C,d + 1,C_00,iVar5 + 1,oup);
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)id) {
    uVar7 = (ulong)id;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    oup[uVar6 + 1] = -oup[uVar6 + 1];
  }
  uVar7 = 0;
  uVar6 = 0;
  if (0 < (int)N) {
    uVar6 = (ulong)N;
  }
  for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
    dVar14 = inp[uVar7];
    if (D == 0 && d == 0) {
      dVar14 = dVar14 - local_38;
    }
    W[uVar7] = dVar14;
    resid[uVar7] = obj->res[uVar7];
  }
  uVar6 = 0;
  uVar7 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    theta[uVar6] = 0.0;
    phi[uVar6] = 0.0;
  }
  uVar6 = 0;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar7 = uVar6;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    phi[uVar6] = obj->phi[uVar6];
  }
  uVar8 = 0;
  uVar6 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar6 = uVar8;
  }
  for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
    theta[uVar8] = -obj->theta[uVar8];
  }
  uVar10 = 0;
  pdVar11 = phi;
  uVar8 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar8 = uVar10;
  }
  while (pdVar11 = pdVar11 + lVar12, uVar10 != uVar8) {
    dVar14 = obj->PHI[uVar10];
    uVar10 = uVar10 + 1;
    phi[uVar10 * lVar12 + -1] = phi[uVar10 * lVar12 + -1] + dVar14;
    for (uVar13 = 0; uVar7 != uVar13; uVar13 = uVar13 + 1) {
      pdVar11[uVar13] = pdVar11[uVar13] - obj->phi[uVar13] * dVar14;
    }
  }
  uVar8 = 0;
  pdVar11 = theta;
  uVar7 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar7 = uVar8;
  }
  while (pdVar11 = pdVar11 + lVar12, uVar8 != uVar7) {
    dVar14 = obj->THETA[uVar8];
    uVar8 = uVar8 + 1;
    theta[uVar8 * lVar12 + -1] = theta[uVar8 * lVar12 + -1] - dVar14;
    for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
      pdVar11[uVar10] = obj->theta[uVar10] * dVar14 + pdVar11[uVar10];
    }
  }
  forkal(ip,s * uVar4 + uVar2,id,phi,theta,oup + 1,N,W,resid,L,xpred,amse);
  uVar6 = 0;
  uVar7 = (ulong)(uint)L;
  if (L < 1) {
    uVar7 = 0;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    xpred[uVar6] = xpred[uVar6] + local_38;
  }
  free(C);
  free(C_00);
  free(oup);
  free(W);
  free(resid);
  free(phi);
  free(theta);
  return;
}

Assistant:

void sarima_predict(sarima_object obj, double *inp, int L, double *xpred, double *amse) {
	int d, i, N, ip, iq, ir,D,P,Q,s,p,q,t,ps,qs,j;
	double *coef1,*coef2,*delta, *W, *resid, *phi, *theta;
	double wmean;

	d = obj->d;
	N = obj->N;
	p = obj->p;
	q = obj->q;
	D = obj->D;
	P = obj->P;
	Q = obj->Q;
	s = obj->s;

	ip = p + s * P;
	iq = q + s * Q;
	ir = p + s * P;

	t = 1 + q + s*Q;
	if (ir < t) {
		ir = t;
	}
	ps = P;
	qs = Q;
	coef1 = (double*)malloc(sizeof(double)* (d + 1));
	coef2 = (double*)malloc(sizeof(double)* (D*s + 1));
	delta = (double*)malloc(sizeof(double)* (d + D*s + 1));
	W = (double*)malloc(sizeof(double)* N);
	resid = (double*)malloc(sizeof(double)* N);


	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	wmean = 0.0;
	coef1[0] = coef2[0] = 1.0;

	if (d == 0 && D == 0) {
		*delta = 1.0;
		wmean = obj->mean;
	}

	if (d > 0) {
		deld(d, coef1);
	}

	if (D > 0) {
		delds(D, s, coef2);
	}

	conv(coef1, d + 1, coef2, D*s + 1, delta);
	
	for (i = 1; i <= d+D*s; ++i) {
		delta[i] = -1.0 * delta[i];
	}
	for (i = 0; i < N; ++i) {
		W[i] = inp[i];
		if (d == 0 && D == 0) {
			W[i] -= wmean;
		}
		resid[i] = obj->res[i];
	}
	for (i = 0; i < ir; ++i) {
		phi[i] = theta[i] = 0.0;
	}

	for (i = 0; i < p; ++i) {
		phi[i] = obj->phi[i];
	}

	for (i = 0; i < q; ++i) {
		theta[i] = -1.0 *  obj->theta[i];
	}

	for (j = 0; j < ps; ++j) {
		phi[(j + 1)*s - 1] += obj->PHI[j];
		for (i = 0; i < p; ++i) {
			phi[(j + 1)*s + i] -= obj->phi[i] * obj->PHI[j];
		}
	}

	for (j = 0; j < qs; ++j) {
		theta[(j + 1)*s - 1] -= obj->THETA[j];
		for (i = 0; i < q; ++i) {
			theta[(j + 1)*s + i] += obj->theta[i] * obj->THETA[j];
		}
	}

	forkal(ip, iq, d+D*s, phi, theta, delta + 1, N, W, resid, L, xpred, amse);

	for (i = 0; i < L; ++i) {
		xpred[i] += wmean;
	}

	free(coef1);
	free(coef2);
	free(delta);
	free(W);
	free(resid);
	free(phi);
	free(theta);
}